

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_AddTxInOut_Test::~ConfidentialTransactionContext_AddTxInOut_Test
          (ConfidentialTransactionContext_AddTxInOut_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddTxInOut)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(7300),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kElementsRegtest);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(Script(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);
  EXPECT_TRUE(txc.IsFindFeeTxOut(&index));
  EXPECT_EQ(index, 0);
  ConfidentialAssetId asset;
  EXPECT_EQ(txc.GetFeeAmount(&asset).GetSatoshiValue(), 7300);
  EXPECT_STREQ(asset.GetHex().c_str(), "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index, &indexes));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(indexes.size(), 2);
  if (indexes.size() == 2) {
    EXPECT_EQ(indexes[0], 1);
    EXPECT_EQ(indexes[1], 2);
  }
}